

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteColumnNames(sqlite3 *db,Table *pTable)

{
  Column *local_28;
  Column *pCol;
  int i;
  Table *pTable_local;
  sqlite3 *db_local;
  
  local_28 = pTable->aCol;
  if (local_28 != (Column *)0x0) {
    for (pCol._4_4_ = 0; pCol._4_4_ < pTable->nCol; pCol._4_4_ = pCol._4_4_ + 1) {
      sqlite3DbFree(db,local_28->zName);
      sqlite3ExprDelete(db,local_28->pDflt);
      sqlite3DbFree(db,local_28->zColl);
      local_28 = local_28 + 1;
    }
    sqlite3DbFree(db,pTable->aCol);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      sqlite3DbFree(db, pCol->zName);
      sqlite3ExprDelete(db, pCol->pDflt);
      sqlite3DbFree(db, pCol->zColl);
    }
    sqlite3DbFree(db, pTable->aCol);
  }
}